

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall
fasttext::QuantMatrix::averageRowsToVector
          (QuantMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator cVar2;
  reference piVar3;
  size_type sVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  Vector *in_RDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  const_iterator it;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc0
  ;
  real a;
  
  Vector::zero(in_RDI);
  this_00 = std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffffb8);
  while( true ) {
    auVar5 = in_ZMM0._0_16_;
    cVar2 = std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffffb8);
    a = (real)((ulong)cVar2._M_current >> 0x20);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffffe0);
    in_ZMM0._0_8_ = (**(code **)((in_RDI->data_).mem_ + 8))(in_RDI,in_RSI,*piVar3);
    in_ZMM0._8_56_ = extraout_var;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffe0);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  vcvtusi2sd_avx512f(auVar5,sVar4);
  Vector::mul((Vector *)this_00._M_current,a);
  return;
}

Assistant:

void QuantMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}